

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

int select_reg(reg_state *state,int vreg,int loc,int src)

{
  uint uVar1;
  dill_stream_conflict s;
  arg_info_list paVar2;
  private_ctx pdVar3;
  bool bVar4;
  vreg_info *pvVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  size_t size;
  uint uVar13;
  long lVar14;
  preg_info *ppVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int tmp;
  bitv tmp_assigns [6];
  preg_info *local_88;
  uint local_6c;
  preg_info *local_68;
  long local_60;
  vreg_info *local_58;
  basic_block_conflict local_50;
  undefined1 local_48 [10];
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined6 uStack_36;
  
  uVar12 = (ulong)(uint)vreg;
  s = state->c;
  local_50 = state->bb;
  local_58 = s->p->vregs;
  local_88 = state->fpregs;
  local_68 = state->ipregs;
  lVar18 = (long)vreg;
  iVar7 = dill_type_of(s,vreg);
  ppVar15 = (&state->fpregs)[1 < iVar7 - 9U];
  if (select_reg::reg_debug == -1) {
    pcVar10 = getenv("REG_DEBUG");
    select_reg::reg_debug = (int)(pcVar10 != (char *)0x0);
  }
  if ((vreg < 100) && (paVar2 = s->p->c_param_args, paVar2[lVar18].is_register != '\0')) {
    return paVar2[lVar18].in_reg;
  }
  if (vreg == 100) {
    return s->dill_local_pointer;
  }
  iVar7 = dill_type_of(s,vreg);
  if (iVar7 == 0xc) {
    return -1;
  }
  pdVar3 = state->c->p;
  if (vreg < 100) {
    if (pdVar3->c_param_args[lVar18].is_register == '\0') {
      piVar11 = &state->param_info[lVar18].in_reg;
    }
    else {
      piVar11 = &pdVar3->c_param_args[lVar18].in_reg;
    }
  }
  else {
    piVar11 = &pdVar3->vregs[uVar12 - 100].in_reg;
  }
  if (*piVar11 != -1) {
    if (vreg < 100) {
      if (pdVar3->c_param_args[lVar18].is_register == '\0') {
        piVar11 = &state->param_info[lVar18].in_reg;
      }
      else {
        piVar11 = &pdVar3->c_param_args[lVar18].in_reg;
      }
    }
    else {
      piVar11 = &pdVar3->vregs[uVar12 - 100].in_reg;
    }
    iVar7 = *piVar11;
    if (vreg < 100) {
      if (pdVar3->c_param_args[lVar18].is_register != '\0') goto LAB_001138b7;
      pvVar5 = state->param_info + lVar18;
    }
    else {
      pvVar5 = pdVar3->vregs + (uVar12 - 100);
    }
    pvVar5->assign_loc = loc;
LAB_001138b7:
    if (src == 0) {
      if (vreg < 100) {
        if (pdVar3->c_param_args[lVar18].is_register == '\0') {
          state->param_info[lVar18].update_in_reg = 1;
        }
      }
      else {
        pdVar3->vregs[uVar12 - 100].update_in_reg = 1;
      }
    }
    return iVar7;
  }
  local_48._0_2_ = 0x16;
  local_48._2_8_ = 0;
  uStack_3e = 0;
  uStack_38 = 0;
  uStack_36 = 0;
  if (select_reg::reg_debug != 0) {
    printf("Get assignment for vreg %d\n",uVar12);
  }
  uVar13 = 0xffffffff;
  uVar16 = 0xffffffff;
  local_60 = lVar18;
  do {
    iVar7 = dill_type_of(s,(int)lVar18);
    dill_raw_getreg(s,(dill_reg *)&local_6c,iVar7,0);
    uVar6 = local_6c;
    lVar17 = (long)(int)local_6c;
    if (lVar17 == -1) break;
    local_48[(long)((int)local_6c >> 3) + 2] =
         local_48[(long)((int)local_6c >> 3) + 2] | (byte)(1 << ((byte)local_6c & 7));
    if (select_reg::reg_debug != 0) {
      printf("checking preg %d\n");
    }
    if (state->reg_count <= (int)uVar6) {
      size = (lVar17 + 1) * 0x38;
      local_88 = (preg_info *)dill_realloc(local_88,size);
      local_68 = (preg_info *)dill_realloc(local_68,size);
      lVar18 = local_60;
      state->fpregs = local_88;
      state->ipregs = local_68;
      iVar7 = state->reg_count;
      if (iVar7 <= (int)uVar6) {
        lVar14 = 0;
        do {
          local_88[iVar7 + lVar14].holds = -1;
          local_68[iVar7 + lVar14].holds = -1;
          lVar14 = lVar14 + 1;
        } while ((uVar6 - iVar7) + 1 != (int)lVar14);
      }
      iVar7 = dill_type_of(s,(int)local_60);
      ppVar15 = (&state->fpregs)[1 < iVar7 - 9U];
      state->reg_count = (int)(lVar17 + 1);
    }
    uVar1 = ppVar15[lVar17].holds;
    uVar12 = (ulong)uVar1;
    if (uVar12 == 0xffffffff) {
      bVar4 = true;
      uVar16 = uVar6;
      if (select_reg::reg_debug == 0) goto LAB_00113655;
      pcVar10 = "preg %d empty, assigning to vreg %d\n";
      uVar12 = (ulong)(uint)vreg;
LAB_0011361c:
      bVar4 = true;
      printf(pcVar10,(ulong)uVar6,uVar12);
      uVar16 = uVar6;
    }
    else {
      pdVar3 = state->c->p;
      if ((int)uVar1 < 100) {
        iVar7 = 0;
        if (pdVar3->c_param_args[(int)uVar1].is_register == '\0') {
          pvVar5 = state->param_info + (int)uVar1;
          goto LAB_00113580;
        }
      }
      else {
        pvVar5 = pdVar3->vregs + (uVar12 - 100);
LAB_00113580:
        iVar7 = pvVar5->assign_loc;
      }
      if ((src == 0) || (iVar7 != loc)) {
        if ((int)uVar1 < 100) {
          iVar7 = 0;
          if (pdVar3->c_param_args[(int)uVar1].is_register == '\0') {
            pvVar5 = state->param_info + (int)uVar1;
            goto LAB_001135fd;
          }
        }
        else {
          pvVar5 = pdVar3->vregs + (uVar12 - 100);
LAB_001135fd:
          iVar7 = pvVar5->last_use;
        }
        if (iVar7 < loc) {
LAB_00113607:
          bVar4 = true;
          uVar16 = uVar6;
          if (select_reg::reg_debug != 0) {
            pcVar10 = "preg %d assigned to vreg %d, but that vreg is done, assigning\n";
            goto LAB_0011361c;
          }
        }
        else {
          if (src == 0) {
            if ((int)uVar1 < 100) {
              iVar7 = 0;
              if (pdVar3->c_param_args[(int)uVar1].is_register == '\0') {
                pvVar5 = state->param_info + (int)uVar1;
                goto LAB_0011368e;
              }
            }
            else {
              pvVar5 = pdVar3->vregs + (uVar12 - 100);
LAB_0011368e:
              iVar7 = pvVar5->last_use;
            }
            if (iVar7 == loc) goto LAB_00113607;
          }
          if (uVar13 == 0xffffffff) {
            uVar13 = uVar6;
            if (select_reg::reg_debug != 0) {
              pcVar10 = "preg %d is new tentative assign\n";
LAB_0011376b:
              printf(pcVar10,(ulong)uVar6);
              uVar13 = uVar6;
            }
          }
          else {
            lVar17 = (long)ppVar15[(int)uVar13].holds;
            if (lVar17 < 100) {
              iVar7 = 0;
              if (pdVar3->c_param_args[lVar17].is_register == '\0') {
                pvVar5 = state->param_info + lVar17;
                goto LAB_00113705;
              }
            }
            else {
              pvVar5 = pdVar3->vregs + lVar17 + -100;
LAB_00113705:
              iVar7 = pvVar5->use_metric;
            }
            if ((int)uVar1 < 100) {
              iVar8 = 0;
              if (pdVar3->c_param_args[(int)uVar1].is_register == '\0') {
                pvVar5 = state->param_info + (int)uVar1;
                goto LAB_00113751;
              }
            }
            else {
              pvVar5 = pdVar3->vregs + (long)(int)uVar1 + -100;
LAB_00113751:
              iVar8 = pvVar5->use_metric;
            }
            if (iVar8 < iVar7) {
              uVar13 = uVar6;
              if (select_reg::reg_debug != 0) {
                pcVar10 = "preg %d is better tentative assign\n";
                goto LAB_0011376b;
              }
            }
            else if (select_reg::reg_debug != 0) {
              printf("previous assign %d was better tentative assign\n");
            }
          }
          bVar4 = false;
        }
      }
      else {
        if (select_reg::reg_debug != 0) {
          printf("preg %d assigned to vreg %d at this loc\n",(ulong)uVar6);
        }
        bVar4 = false;
      }
    }
LAB_00113655:
  } while (!bVar4);
  if (uVar16 != 0xffffffff) {
    uVar13 = uVar16;
  }
  iVar8 = (int)lVar18;
  iVar7 = dill_type_of(s,iVar8);
  foreach_bit((bit_vec)local_48,put_unless,s,(void *)((long)iVar7 << 0x18 | 0xffffff));
  if (uVar13 == 0xffffffff) {
    uVar16 = 0xffffffff;
  }
  else {
    uVar16 = ppVar15[(int)uVar13].holds;
  }
  if (uVar16 != 0xffffffff) {
    pdVar3 = state->c->p;
    if ((int)uVar16 < 100) {
      iVar7 = 0;
      if (pdVar3->c_param_args[(int)uVar16].is_register == '\0') {
        pvVar5 = state->param_info + (int)uVar16;
        goto LAB_0011390f;
      }
    }
    else {
      pvVar5 = pdVar3->vregs + ((ulong)uVar16 - 100);
LAB_0011390f:
      iVar7 = pvVar5->last_use;
    }
    if (loc < iVar7) {
LAB_00113943:
      if ((int)uVar16 < 100) {
LAB_00113962:
        if (pdVar3->c_param_args[(int)uVar16].is_register != '\0') goto LAB_00113b42;
        pvVar5 = state->param_info + (int)uVar16;
      }
      else {
        pvVar5 = pdVar3->vregs + ((ulong)uVar16 - 100);
      }
      if (pvVar5->update_in_reg != 0) {
        if ((int)uVar16 < 100) {
          piVar11 = &s->p->c_param_args[(int)uVar16].offset;
        }
        else {
          piVar11 = &s->p->vregs[(ulong)uVar16 - 100].offset;
        }
        iVar7 = *piVar11;
        iVar9 = dill_type_of(s,uVar16);
        pdVar3 = state->c->p;
        if ((int)uVar16 < 100) {
          if (pdVar3->c_param_args[(int)uVar16].is_register == '\0') {
            pvVar5 = state->param_info + (int)uVar16;
            goto LAB_00113a6e;
          }
        }
        else {
          pvVar5 = pdVar3->vregs + ((ulong)uVar16 - 100);
LAB_00113a6e:
          pvVar5->value_in_mem = 1;
        }
        if ((int)uVar16 < 100) {
          if (pdVar3->c_param_args[(int)uVar16].is_register == '\0') {
            pvVar5 = state->param_info + (int)uVar16;
            goto LAB_00113abb;
          }
        }
        else {
          pvVar5 = pdVar3->vregs + ((ulong)uVar16 - 100);
LAB_00113abb:
          pvVar5->update_in_reg = 0;
        }
        if (iVar7 == -0x21524111) {
          iVar7 = (*s->j->local)(s,0,iVar9);
          local_58[(long)(int)uVar16 + -100].offset = iVar7;
        }
        if (select_reg::reg_debug != 0) {
          printf("Spilling vreg %d to memory, new assignment is %d\n",(ulong)uVar16,
                 (ulong)(uint)vreg);
        }
        (*s->j->storei)(s,iVar9,0,uVar13,(&s->dill_local_pointer)[(int)uVar16 < 100],(long)iVar7);
      }
    }
    else {
      if ((int)uVar16 < 100) goto LAB_00113962;
      if (((byte)local_50->live_at_end->vec[(int)(uVar16 - 100) >> 3] >> (uVar16 - 100 & 7) & 1) !=
          0) goto LAB_00113943;
    }
LAB_00113b42:
    pdVar3 = state->c->p;
    if ((int)uVar16 < 100) {
      if (pdVar3->c_param_args[(int)uVar16].is_register != '\0') goto LAB_00113b96;
      pvVar5 = state->param_info + (int)uVar16;
    }
    else {
      pvVar5 = pdVar3->vregs + ((ulong)uVar16 - 100);
    }
    pvVar5->in_reg = -1;
  }
LAB_00113b96:
  if (src == 0) {
LAB_00113c1b:
    pdVar3 = state->c->p;
    if (vreg < 100) {
      if (pdVar3->c_param_args[lVar18].is_register == '\0') {
        state->param_info[lVar18].update_in_reg = 1;
      }
    }
    else {
      pdVar3->vregs[(ulong)(uint)vreg - 100].update_in_reg = 1;
    }
  }
  else {
    pdVar3 = state->c->p;
    if (vreg < 100) {
      if (pdVar3->c_param_args[lVar18].is_register != '\0') goto LAB_00113c1b;
      pvVar5 = state->param_info + lVar18;
    }
    else {
      pvVar5 = pdVar3->vregs + ((ulong)(uint)vreg - 100);
    }
    if (pvVar5->value_in_mem == 0) goto LAB_00113c1b;
    if (vreg < 100) {
      piVar11 = &s->p->c_param_args[lVar18].offset;
    }
    else {
      piVar11 = &s->p->vregs[(ulong)(uint)vreg - 100].offset;
    }
    uVar16 = *piVar11;
    iVar7 = dill_type_of(s,iVar8);
    if (uVar16 == 0xdeadbeef) {
      uVar16 = 0;
      printf("Virtual register %d used as source but not previously assigned \n",(ulong)(uint)vreg);
    }
    if (select_reg::reg_debug != 0) {
      printf("Loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,(ulong)uVar16,
             (ulong)uVar13);
    }
    if (vreg < 100) {
      iVar9 = s->dill_param_reg_pointer;
    }
    else {
      iVar9 = s->dill_local_pointer;
    }
    (*s->j->loadi)(s,iVar7,0,uVar13,iVar9,(long)(int)uVar16);
  }
  if (uVar13 != 0xffffffff) {
    ppVar15[(int)uVar13].holds = vreg;
  }
  pdVar3 = state->c->p;
  if (vreg < 100) {
    if (pdVar3->c_param_args[lVar18].is_register == '\0') {
      pvVar5 = state->param_info + lVar18;
      goto LAB_00113d5f;
    }
  }
  else {
    pvVar5 = pdVar3->vregs + ((ulong)(uint)vreg - 100);
LAB_00113d5f:
    pvVar5->in_reg = uVar13;
  }
  if (vreg < 100) {
    if (pdVar3->c_param_args[lVar18].is_register == '\0') {
      pvVar5 = state->param_info + lVar18;
      goto LAB_00113da1;
    }
  }
  else {
    pvVar5 = pdVar3->vregs + ((ulong)(uint)vreg - 100);
LAB_00113da1:
    pvVar5->assign_loc = loc;
  }
  if (src == 0) {
    return uVar13;
  }
  if (uVar13 != 0xffffffff) {
    return uVar13;
  }
  if (vreg < 100) {
    if (pdVar3->c_param_args[lVar18].is_register != '\0') goto LAB_00113dfc;
    pvVar5 = state->param_info + lVar18;
  }
  else {
    pvVar5 = pdVar3->vregs + ((ulong)(uint)vreg - 100);
  }
  if (pvVar5->value_in_mem != 0) {
    return -1;
  }
LAB_00113dfc:
  if (vreg < 100) {
    piVar11 = &s->p->c_param_args[lVar18].offset;
  }
  else {
    piVar11 = &s->p->vregs[(ulong)(uint)vreg - 100].offset;
  }
  uVar13 = *piVar11;
  iVar7 = dill_type_of(s,iVar8);
  if (select_reg::reg_debug != 0) {
    printf("Special x86 loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,
           (ulong)uVar13,0xffffffff);
  }
  if (vreg < 100) {
    iVar8 = s->dill_param_reg_pointer;
  }
  else {
    iVar8 = s->dill_local_pointer;
  }
  (*s->j->loadi)(s,iVar7,0,-1,iVar8,(long)(int)uVar13);
  return -1;
}

Assistant:

static int
select_reg(reg_state* state, int vreg, int loc, int src)
{
    static int reg_debug = -1;
    int ret_reg = -1;
    int old_vreg = -1;
    vreg_info* vregs = state->c->p->vregs;
    dill_stream c = state->c;
    basic_block bb = state->bb;
    preg_info* pregs;
    preg_info* fpregs = state->fpregs;
    preg_info* ipregs = state->ipregs;
    switch (dill_type_of(c, vreg)) {
    case DILL_F:
    case DILL_D:
        pregs = state->fpregs;
        break;
    default:
        pregs = state->ipregs;
        break;
    }
    if (reg_debug == -1) {
        reg_debug = (getenv("REG_DEBUG") != NULL);
    }
    if (vreg < 100) {
        /* parameter */
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
    }
    if (vreg == 100) {
        return dill_lp(c);
    }
    if (dill_type_of(c, vreg) == DILL_B) {
        /* not really using this */
        return -1;
    }
    if (get_in_reg(state, vreg) != -1) {
        ret_reg = get_in_reg(state, vreg);
        set_assign_loc(state, vreg, loc);
        if (!src)
            set_update_in_reg(state, vreg, 1);
        return ret_reg;
    } else {
        int preg;
        struct bitv tmp_assigns[6];
        int tentative_assign = -1;
        init_bit_vec(&tmp_assigns[0], sizeof(tmp_assigns));
        if (reg_debug)
            printf("Get assignment for vreg %d\n", vreg);
        while ((preg = get_tentative_assign(c, vreg, &tmp_assigns[0])) != -1) {
            int used_vreg;
            if (reg_debug)
                printf("checking preg %d\n", preg);
            if (preg >= state->reg_count) {
                int i;
                fpregs = realloc(fpregs, sizeof(reg_state) * (preg + 1));
                ipregs = realloc(ipregs, sizeof(reg_state) * (preg + 1));
                state->fpregs = fpregs;
                state->ipregs = ipregs;
                for (i = state->reg_count; i <= preg; i++) {
                    ipregs[i].holds = fpregs[i].holds = -1;
                }
                switch (dill_type_of(c, vreg)) {
                case DILL_F:
                case DILL_D:
                    pregs = state->fpregs;
                    break;
                default:
                    pregs = state->ipregs;
                    break;
                }
                state->reg_count = preg + 1;
            }
            used_vreg = pregs[preg].holds;
            if (used_vreg == -1) {
                ret_reg = preg;
                if (reg_debug)
                    printf("preg %d empty, assigning to vreg %d\n", preg, vreg);
                break;
            }
            if ((get_assign_loc(state, used_vreg) == loc) && src) {
                if (reg_debug)
                    printf("preg %d assigned to vreg %d at this loc\n", preg,
                           used_vreg);
                continue;
            }
            if ((get_last_use(state, used_vreg) < loc) ||
                (!src && (get_last_use(state, used_vreg) == loc))) {
                ret_reg = preg;
                if (reg_debug)
                    printf(
                        "preg %d assigned to vreg %d, but that vreg is done, "
                        "assigning\n",
                        preg, used_vreg);
                break;
            }
            if (tentative_assign == -1) {
                tentative_assign = preg;
                if (reg_debug)
                    printf("preg %d is new tentative assign\n", preg);
            } else if (get_use_metric(state, pregs[tentative_assign].holds) >
                       get_use_metric(state, used_vreg)) {
                if (reg_debug)
                    printf("preg %d is better tentative assign\n", preg);
                tentative_assign = preg;
            } else {
                if (reg_debug)
                    printf("previous assign %d was better tentative assign\n",
                           tentative_assign);
            }
        }
        if (ret_reg == -1)
            ret_reg = tentative_assign;
        put_tentative_assigns(c, -1, &tmp_assigns[0], dill_type_of(c, vreg));
    }
    if (ret_reg != -1)
        old_vreg = pregs[ret_reg].holds;
    if (old_vreg != -1) {
        /* if this is not the same as the old assignment */
        if (((get_last_use(state, old_vreg) > loc) ||
             live_at_end(bb, old_vreg)) &&
            update_in_reg(state, old_vreg)) {
            int offset = offset_of(c, old_vreg);
            int typ = dill_type_of(c, old_vreg);
            set_value_in_mem(state, old_vreg, 1);
            set_update_in_reg(state, old_vreg, 0);
            if (offset == 0xdeadbeef) {
                /* not previously spilled */
                offset = vregs[old_vreg - 100].offset = dill_local(c, typ);
            }
            /* spill vreg to memory */
            if (reg_debug)
                printf("Spilling vreg %d to memory, new assignment is %d\n",
                       old_vreg, vreg);
            if (old_vreg >= 100) {
                c->j->storei(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
            } else {
                c->j->storei(c, typ, 0, ret_reg, c->dill_param_reg_pointer,
                             offset);
            }
        }
        set_in_reg(state, old_vreg, -1);
    }
    if (src && value_in_mem(state, vreg)) {
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (offset == 0xdeadbeef) {
            /* not previously assigned */
            printf(
                "Virtual register %d used as source but not previously "
                "assigned \n",
                vreg);
            offset = 0;
        }
        if (reg_debug)
            printf("Loading vreg %d from offset %d into preg %d\n", vreg,
                   offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    } else {
        set_update_in_reg(state, vreg, 1);
    }
    if (ret_reg != -1)
        pregs[ret_reg].holds = vreg;
    set_in_reg(state, vreg, ret_reg);
    set_assign_loc(state, vreg, loc);
    if (src && (ret_reg == -1) && !value_in_mem(state, vreg)) {
        /* special x86 no float regs case */
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (reg_debug)
            printf("Special x86 loading vreg %d from offset %d into preg %d\n",
                   vreg, offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    }
    return ret_reg;
}